

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanDynamicHeap.cpp
# Opt level: O0

MasterBlock __thiscall
Diligent::VulkanDynamicMemoryManager::AllocateMasterBlock
          (VulkanDynamicMemoryManager *this,OffsetType SizeInBytes,OffsetType Alignment)

{
  undefined *puVar1;
  bool bVar2;
  OffsetType OVar3;
  undefined8 uVar4;
  unsigned_long *puVar5;
  rep_conflict rVar6;
  MasterBlock MVar7;
  char (*in_stack_fffffffffffffe68) [164];
  bool local_151;
  OffsetType local_140;
  double local_138;
  int local_12c;
  undefined1 local_128 [8];
  string _msg_3;
  string _msg_2;
  string _msg_1;
  double local_b8;
  int local_ac;
  undefined1 local_a8 [8];
  string _msg;
  duration<long,_std::ratio<1L,_1000000000L>_> local_78;
  rep_conflict local_70;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_68;
  time_point CurrTime;
  int local_4c;
  __enable_if_is_duration<std::chrono::duration<double>_> _Stack_48;
  Uint32 SleepIterations;
  duration<double,_std::ratio<1L,_1L>_> IdleDuration;
  time_point StartIdleTime;
  OffsetType local_30;
  OffsetType Alignment_local;
  OffsetType SizeInBytes_local;
  VulkanDynamicMemoryManager *this_local;
  MasterBlock Block;
  
  local_30 = Alignment;
  if (Alignment == 0) {
    local_30 = 0x400;
  }
  Alignment_local = SizeInBytes;
  SizeInBytes_local = (OffsetType)this;
  OVar3 = DynamicHeap::MasterBlockListBasedManager::GetSize
                    (&this->super_MasterBlockListBasedManager);
  if (OVar3 < SizeInBytes) {
    StartIdleTime.__d.__r =
         (duration)
         DynamicHeap::MasterBlockListBasedManager::GetSize(&this->super_MasterBlockListBasedManager)
    ;
    LogError<false,char[35],unsigned_long,char[38],unsigned_long,char[45]>
              (false,"AllocateMasterBlock",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanDynamicHeap.cpp"
               ,0x96,(char (*) [35])"Requested dynamic allocation size ",&Alignment_local,
               (char (*) [38])" exceeds maximum dynamic memory size ",
               (unsigned_long *)&StartIdleTime,
               (char (*) [45])". The app should increase dynamic heap size.");
    VariableSizeAllocationsManager::Allocation::Allocation((Allocation *)&this_local);
  }
  else {
    _this_local = DynamicHeap::MasterBlockListBasedManager::AllocateMasterBlock
                            (&this->super_MasterBlockListBasedManager,Alignment_local,local_30);
    bVar2 = VariableSizeAllocationsManager::Allocation::IsValid((Allocation *)&this_local);
    if (!bVar2) {
      IdleDuration.__r = (rep_conflict)std::chrono::_V2::system_clock::now();
      local_4c = 0;
      while( true ) {
        bVar2 = VariableSizeAllocationsManager::Allocation::IsValid((Allocation *)&this_local);
        local_151 = false;
        if (!bVar2) {
          local_151 = std::chrono::operator<
                                (&stack0xffffffffffffffb8,&AllocateMasterBlock::MaxIdleDuration);
        }
        if (local_151 == false) break;
        RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
        ::PurgeReleaseQueues
                  (&this->m_DeviceVk->
                    super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                   ,false);
        _CurrTime = DynamicHeap::MasterBlockListBasedManager::AllocateMasterBlock
                              (&this->super_MasterBlockListBasedManager,Alignment_local,local_30);
        _this_local = _CurrTime;
        bVar2 = VariableSizeAllocationsManager::Allocation::IsValid((Allocation *)&this_local);
        if (!bVar2) {
          std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&AllocateMasterBlock::SleepPeriod);
          local_4c = local_4c + 1;
        }
        local_68.__d.__r = (duration)std::chrono::_V2::system_clock::now();
        local_78.__r = (rep)std::chrono::operator-
                                      (&local_68,
                                       (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                        *)&IdleDuration);
        local_70 = (rep_conflict)
                   std::chrono::
                   duration_cast<std::chrono::duration<double,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                             (&local_78);
        _Stack_48 = (__enable_if_is_duration<std::chrono::duration<double>_>)local_70;
      }
      bVar2 = VariableSizeAllocationsManager::Allocation::IsValid((Allocation *)&this_local);
      if (bVar2) {
        if (local_4c == 0) {
          FormatString<char[209]>
                    ((string *)((long)&_msg_3.field_2 + 8),
                     (char (*) [209])
                     "Space in dynamic heap is almost exhausted forcing mid-frame shrinkage. Increase the size of the heap buffer by setting EngineVkCreateInfo::DynamicHeapSize to a greater value or optimize dynamic resource usage"
                    );
          puVar1 = DebugMessageCallback;
          if (DebugMessageCallback != (undefined *)0x0) {
            uVar4 = std::__cxx11::string::c_str();
            (*(code *)puVar1)(1,uVar4,0);
          }
          std::__cxx11::string::~string((string *)(_msg_3.field_2._M_local_buf + 8));
        }
        else {
          local_12c = (int)std::setprecision(1);
          rVar6 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count
                            (&stack0xffffffffffffffb8);
          local_138 = rVar6 * 1000.0;
          FormatString<char[75],std::ios_base&(std::ios_base&),std::_Setprecision,double,char[136]>
                    ((string *)local_128,
                     (Diligent *)
                     "Space in dynamic heap is almost exhausted. Allocation forced wait time of ",
                     (char (*) [75])std::fixed,(_func_ios_base_ptr_ios_base_ptr *)&local_12c,
                     (_Setprecision *)&local_138,
                     (double *)
                     " ms. Increase the size of the heap by setting EngineVkCreateInfo::DynamicHeapSize to a greater value or optimize dynamic resource usage"
                     ,(char (*) [136])in_stack_fffffffffffffe68);
          puVar1 = DebugMessageCallback;
          if (DebugMessageCallback != (undefined *)0x0) {
            uVar4 = std::__cxx11::string::c_str();
            (*(code *)puVar1)(1,uVar4,0);
          }
          std::__cxx11::string::~string((string *)local_128);
        }
      }
      else {
        RenderDeviceVkImpl::IdleGPU(this->m_DeviceVk);
        join_0x00000010_0x00000000_ =
             DynamicHeap::MasterBlockListBasedManager::AllocateMasterBlock
                       (&this->super_MasterBlockListBasedManager,Alignment_local,local_30);
        _this_local = join_0x00000010_0x00000000_;
        bVar2 = VariableSizeAllocationsManager::Allocation::IsValid((Allocation *)&this_local);
        if (bVar2) {
          FormatString<char[208]>
                    ((string *)((long)&_msg_2.field_2 + 8),
                     (char (*) [208])
                     "Space in dynamic heap is almost exhausted. Allocation forced idling the GPU. Increase the size of the heap by setting EngineVkCreateInfo::DynamicHeapSize to a greater value or optimize dynamic resource usage"
                    );
          puVar1 = DebugMessageCallback;
          if (DebugMessageCallback != (undefined *)0x0) {
            uVar4 = std::__cxx11::string::c_str();
            (*(code *)puVar1)(1,uVar4,0);
          }
          std::__cxx11::string::~string((string *)(_msg_2.field_2._M_local_buf + 8));
        }
        else {
          local_ac = (int)std::setprecision(1);
          rVar6 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count
                            (&stack0xffffffffffffffb8);
          local_b8 = rVar6 * 1000.0;
          FormatString<char[54],std::ios_base&(std::ios_base&),std::_Setprecision,double,char[164]>
                    ((string *)local_a8,
                     (Diligent *)"Space in dynamic heap is exhausted! After idling for ",
                     (char (*) [54])std::fixed,(_func_ios_base_ptr_ios_base_ptr *)&local_ac,
                     (_Setprecision *)&local_b8,
                     (double *)
                     " ms still no space is available. Increase the size of the heap by setting EngineVkCreateInfo::DynamicHeapSize to a greater value or optimize dynamic resource usage"
                     ,in_stack_fffffffffffffe68);
          puVar1 = DebugMessageCallback;
          if (DebugMessageCallback != (undefined *)0x0) {
            uVar4 = std::__cxx11::string::c_str();
            (*(code *)puVar1)(2,uVar4,0);
          }
          std::__cxx11::string::~string((string *)local_a8);
        }
      }
    }
    bVar2 = VariableSizeAllocationsManager::Allocation::IsValid((Allocation *)&this_local);
    if (bVar2) {
      local_140 = DynamicHeap::MasterBlockListBasedManager::GetUsedSize
                            (&this->super_MasterBlockListBasedManager);
      puVar5 = std::max<unsigned_long>(&this->m_TotalPeakSize,&local_140);
      this->m_TotalPeakSize = *puVar5;
    }
  }
  MVar7.UnalignedOffset = (OffsetType)this_local;
  MVar7.Size = Block.UnalignedOffset;
  return MVar7;
}

Assistant:

VulkanDynamicMemoryManager::MasterBlock VulkanDynamicMemoryManager::AllocateMasterBlock(OffsetType SizeInBytes, OffsetType Alignment)
{
    if (Alignment == 0)
        Alignment = MasterBlockAlignment;

    if (SizeInBytes > GetSize())
    {
        LOG_ERROR("Requested dynamic allocation size ", SizeInBytes,
                  " exceeds maximum dynamic memory size ", GetSize(),
                  ". The app should increase dynamic heap size.");
        return MasterBlock{};
    }

    auto Block = TBase::AllocateMasterBlock(SizeInBytes, Alignment);
    if (!Block.IsValid())
    {
        // Allocation failed. Try to wait for GPU to finish pending frames to release some space
        auto                          StartIdleTime   = std::chrono::high_resolution_clock::now();
        static constexpr const auto   SleepPeriod     = std::chrono::milliseconds(1);
        static constexpr const auto   MaxIdleDuration = std::chrono::duration<double>{60.0 / 1000.0}; // 60 ms
        std::chrono::duration<double> IdleDuration;
        Uint32                        SleepIterations = 0;
        while (!Block.IsValid() && IdleDuration < MaxIdleDuration)
        {
            m_DeviceVk.PurgeReleaseQueues();
            Block = TBase::AllocateMasterBlock(SizeInBytes, Alignment);
            if (!Block.IsValid())
            {
                std::this_thread::sleep_for(SleepPeriod);
                ++SleepIterations;
            }

            auto CurrTime = std::chrono::high_resolution_clock::now();
            IdleDuration  = std::chrono::duration_cast<std::chrono::duration<double>>(CurrTime - StartIdleTime);
        }

        if (!Block.IsValid())
        {
            // Last resort - idle GPU (there seems to have been a driver bug at some point: vkQueueWaitIdle() would deadlock and never return)
            m_DeviceVk.IdleGPU();
            Block = TBase::AllocateMasterBlock(SizeInBytes, Alignment);
            if (!Block.IsValid())
            {
                LOG_ERROR_MESSAGE("Space in dynamic heap is exhausted! After idling for ",
                                  std::fixed, std::setprecision(1), IdleDuration.count() * 1000.0,
                                  " ms still no space is available. Increase the size of the heap by setting "
                                  "EngineVkCreateInfo::DynamicHeapSize to a greater value or optimize dynamic resource usage");
            }
            else
            {
                LOG_WARNING_MESSAGE("Space in dynamic heap is almost exhausted. Allocation forced idling the GPU. "
                                    "Increase the size of the heap by setting EngineVkCreateInfo::DynamicHeapSize to a "
                                    "greater value or optimize dynamic resource usage");
            }
        }
        else
        {
            if (SleepIterations == 0)
            {
                LOG_WARNING_MESSAGE("Space in dynamic heap is almost exhausted forcing mid-frame shrinkage. "
                                    "Increase the size of the heap buffer by setting EngineVkCreateInfo::DynamicHeapSize to a "
                                    "greater value or optimize dynamic resource usage");
            }
            else
            {
                LOG_WARNING_MESSAGE("Space in dynamic heap is almost exhausted. Allocation forced wait time of ",
                                    std::fixed, std::setprecision(1), IdleDuration.count() * 1000.0,
                                    " ms. Increase the size of the heap by setting EngineVkCreateInfo::DynamicHeapSize "
                                    "to a greater value or optimize dynamic resource usage");
            }
        }
    }

    if (Block.IsValid())
    {
        m_TotalPeakSize = std::max(m_TotalPeakSize, GetUsedSize());
    }

    return Block;
}